

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Molecule.cpp
# Opt level: O3

Vector3d * __thiscall OpenMD::Molecule::getComVel(Vector3d *__return_storage_ptr__,Molecule *this)

{
  double *pdVar1;
  double dVar2;
  pointer ppSVar3;
  StuntDouble *pSVar4;
  Vector3d *velCom;
  uint i_2;
  pointer ppSVar5;
  long lVar6;
  double dVar7;
  Vector<double,_3U> result;
  double local_18 [3];
  
  velCom = __return_storage_ptr__;
  (__return_storage_ptr__->super_Vector<double,_3U>).data_[0] = 0.0;
  (__return_storage_ptr__->super_Vector<double,_3U>).data_[1] = 0.0;
  (__return_storage_ptr__->super_Vector<double,_3U>).data_[2] = 0.0;
  ppSVar5 = (this->integrableObjects_).
            super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppSVar3 = (this->integrableObjects_).
            super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  dVar7 = 0.0;
  if (ppSVar5 != ppSVar3) {
    pSVar4 = *ppSVar5;
    while (pSVar4 != (StuntDouble *)0x0) {
      dVar2 = pSVar4->mass_;
      lVar6 = *(long *)((long)&(pSVar4->snapshotMan_->currentSnapshot_->atomData).velocity.
                               super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + pSVar4->storage_);
      local_18[2] = (double)*(undefined8 *)(lVar6 + 0x10 + (long)pSVar4->localIndex_ * 0x18);
      pdVar1 = (double *)(lVar6 + (long)pSVar4->localIndex_ * 0x18);
      local_18[0] = *pdVar1;
      local_18[1] = pdVar1[1];
      result.data_[0] = 0.0;
      result.data_[1] = 0.0;
      result.data_[2] = 0.0;
      lVar6 = 0;
      do {
        result.data_[lVar6] = local_18[lVar6] * dVar2;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 3);
      lVar6 = 0;
      do {
        (__return_storage_ptr__->super_Vector<double,_3U>).data_[lVar6] =
             result.data_[lVar6] + (__return_storage_ptr__->super_Vector<double,_3U>).data_[lVar6];
        lVar6 = lVar6 + 1;
      } while (lVar6 != 3);
      dVar7 = dVar7 + dVar2;
      ppSVar5 = ppSVar5 + 1;
      if (ppSVar5 == ppSVar3) break;
      pSVar4 = *ppSVar5;
    }
  }
  lVar6 = 0;
  do {
    (__return_storage_ptr__->super_Vector<double,_3U>).data_[lVar6] =
         (__return_storage_ptr__->super_Vector<double,_3U>).data_[lVar6] / dVar7;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  return velCom;
}

Assistant:

Vector3d Molecule::getComVel() {
    StuntDouble* sd;
    std::vector<StuntDouble*>::iterator i;
    Vector3d velCom;
    RealType totalMass = 0;
    RealType mass;

    for (sd = beginIntegrableObject(i); sd != NULL;
         sd = nextIntegrableObject(i)) {
      mass = sd->getMass();
      totalMass += mass;
      velCom += sd->getVel() * mass;
    }

    velCom /= totalMass;

    return velCom;
  }